

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeTestTest.cpp
# Opt level: O0

void __thiscall SafeTestTest::SafeTestTest(SafeTestTest *this)

{
  shared_ptr<oout::EqualMatch> local_c0;
  shared_ptr<oout::EqualMatch> local_b0;
  shared_ptr<oout::EqualMatch> local_98;
  shared_ptr<oout::FunctionText> local_88;
  shared_ptr<oout::MatchTest> local_78;
  shared_ptr<TestText> local_68;
  shared_ptr<const_oout::NamedTest> local_58 [2];
  allocator<char> local_31;
  string local_30;
  SafeTestTest *local_10;
  SafeTestTest *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"SafeTest test",&local_31);
  std::make_shared<oout::FunctionText,SafeTestTest::SafeTestTest()::__0>
            ((anon_class_1_0_00000001 *)&local_98);
  std::make_shared<oout::EqualMatch,char_const(&)[5]>((char (*) [5])&local_b0);
  std::
  make_shared<oout::MatchTest,std::shared_ptr<oout::FunctionText>,std::shared_ptr<oout::EqualMatch>>
            (&local_88,&local_98);
  std::make_shared<oout::SafeTest,std::shared_ptr<oout::MatchTest>>(&local_78);
  std::make_shared<TestText,std::shared_ptr<oout::SafeTest>>
            ((shared_ptr<oout::SafeTest> *)&local_68);
  std::make_shared<oout::EqualMatch,char_const(&)[6]>((char (*) [6])&local_c0);
  std::
  make_shared<oout::NamedTest_const,char_const(&)[46],std::shared_ptr<TestText>,std::shared_ptr<oout::EqualMatch>>
            ((char (*) [46])local_58,
             (shared_ptr<TestText> *)"SafeTest produce error if exceprion are throw",
             (shared_ptr<oout::EqualMatch> *)&local_68);
  oout::dirty::Test::Test<std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_30,local_58);
  std::shared_ptr<const_oout::NamedTest>::~shared_ptr(local_58);
  std::shared_ptr<oout::EqualMatch>::~shared_ptr(&local_c0);
  std::shared_ptr<TestText>::~shared_ptr(&local_68);
  std::shared_ptr<oout::SafeTest>::~shared_ptr((shared_ptr<oout::SafeTest> *)&local_78);
  std::shared_ptr<oout::MatchTest>::~shared_ptr((shared_ptr<oout::MatchTest> *)&local_88);
  std::shared_ptr<oout::EqualMatch>::~shared_ptr(&local_b0);
  std::shared_ptr<oout::FunctionText>::~shared_ptr((shared_ptr<oout::FunctionText> *)&local_98);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__SafeTestTest_00324800;
  return;
}

Assistant:

SafeTestTest::SafeTestTest()
: dirty::Test(
	"SafeTest test",
	make_shared<const NamedTest>(
		"SafeTest produce error if exceprion are throw",
		make_shared<TestText>(
			make_shared<SafeTest>(
				make_shared<MatchTest>(
					make_shared<FunctionText>(
						[]() -> string {
							throw runtime_error("Shit");
						}
					),
					make_shared<EqualMatch>("Good")  // Not happen
				)
			)
		),
		make_shared<EqualMatch>("error")
	)
)
{
}